

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::BringWindowToDisplayFront(ImGuiWindow *window)

{
  int iVar1;
  ImGuiWindow **ppIVar2;
  bool bVar3;
  ImGuiContext *pIVar4;
  uint uVar5;
  int iVar6;
  
  pIVar4 = GImGui;
  ppIVar2 = (GImGui->Windows).Data;
  iVar1 = (GImGui->Windows).Size;
  if ((ppIVar2[(long)iVar1 + -1] != window) &&
     (1 < iVar1 && ppIVar2[(long)iVar1 + -1]->RootWindow != window)) {
    iVar6 = 1;
    uVar5 = iVar1 - 2;
    do {
      if (ppIVar2[uVar5] == window) {
        memmove(ppIVar2 + uVar5,ppIVar2 + (ulong)uVar5 + 1,(long)iVar6 << 3);
        (pIVar4->Windows).Data[(long)(pIVar4->Windows).Size + -1] = window;
        return;
      }
      iVar6 = iVar6 + 1;
      bVar3 = 0 < (int)uVar5;
      uVar5 = uVar5 - 1;
    } while (bVar3);
  }
  return;
}

Assistant:

void ImGui::BringWindowToDisplayFront(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* current_front_window = g.Windows.back();
    if (current_front_window == window || current_front_window->RootWindow == window) // Cheap early out (could be better)
        return;
    for (int i = g.Windows.Size - 2; i >= 0; i--) // We can ignore the top-most window
        if (g.Windows[i] == window)
        {
            memmove(&g.Windows[i], &g.Windows[i + 1], (size_t)(g.Windows.Size - i - 1) * sizeof(ImGuiWindow*));
            g.Windows[g.Windows.Size - 1] = window;
            break;
        }
}